

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void openjtalk_stop(OpenJTalk *oj)

{
  short *__ptr;
  SpeakData *pSVar1;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    g_psd->stop = true;
    do {
      sleep_internal(100);
      pSVar1 = g_psd;
    } while (g_psd->speaking != false);
    pSVar1->stop = false;
    pSVar1->pause = false;
    pSVar1->counter = 0;
    pSVar1->paused = false;
    pSVar1->finished = true;
    __ptr = pSVar1->data;
    if (__ptr != (short *)0x0) {
      free(__ptr);
      g_psd->data = (short *)0x0;
    }
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_stop(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	g_psd->stop = true;
	do
	{
		sleep_internal(100);
	} while (g_psd->speaking);
	g_psd->stop = false;

	g_psd->counter = 0;
	g_psd->finished = true;
	g_psd->pause = false;
	g_psd->paused = false;

	if (g_psd->data)
	{
		free(g_psd->data);
		g_psd->data = NULL;
	}
}